

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O3

void RegisterBlockchainRPCCommands(CRPCTable *t)

{
  string category;
  string category_00;
  string category_01;
  string category_02;
  string category_03;
  string category_04;
  string category_05;
  string category_06;
  string category_07;
  string category_08;
  string category_09;
  string category_10;
  string category_11;
  string category_12;
  string category_13;
  string category_14;
  string category_15;
  string category_16;
  string category_17;
  string category_18;
  string category_19;
  string category_20;
  string category_21;
  string category_22;
  string category_23;
  string category_24;
  string category_25;
  string category_26;
  string category_27;
  int iVar1;
  CRPCCommand *pcmd;
  long lVar2;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffc28;
  undefined1 *puVar3;
  undefined8 in_stack_fffffffffffffc30;
  long in_stack_fffffffffffffc38;
  undefined8 in_stack_fffffffffffffc40;
  long *local_3b8 [2];
  long local_3a8 [2];
  long *local_398 [2];
  long local_388 [2];
  long *local_378 [2];
  long local_368 [2];
  long *local_358 [2];
  long local_348 [2];
  long *local_338 [2];
  long local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  long *local_2f8 [2];
  long local_2e8 [2];
  long *local_2d8 [2];
  long local_2c8 [2];
  long *local_2b8 [2];
  long local_2a8 [2];
  long *local_298 [2];
  long local_288 [2];
  long *local_278 [2];
  long local_268 [2];
  long *local_258 [2];
  long local_248 [2];
  long *local_238 [2];
  long local_228 [2];
  long *local_218 [2];
  long local_208 [2];
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8 [2];
  long local_1a8 [2];
  long *local_198 [2];
  long local_188 [2];
  long *local_178 [2];
  long local_168 [2];
  long *local_158 [2];
  long local_148 [2];
  long *local_138 [2];
  long local_128 [2];
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterBlockchainRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterBlockchainRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"blockchain","");
      category._M_string_length = in_stack_fffffffffffffc30;
      category._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands,category,(RpcMethodFnType)local_58);
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"blockchain","");
      category_00._M_string_length = in_stack_fffffffffffffc30;
      category_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_00.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_00.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 1,category_00,(RpcMethodFnType)local_78);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"blockchain","");
      category_01._M_string_length = in_stack_fffffffffffffc30;
      category_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_01.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_01.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 2,category_01,(RpcMethodFnType)local_98);
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"blockchain","");
      category_02._M_string_length = in_stack_fffffffffffffc30;
      category_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_02.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_02.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 3,category_02,(RpcMethodFnType)local_b8);
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"blockchain","");
      category_03._M_string_length = in_stack_fffffffffffffc30;
      category_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_03.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_03.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 4,category_03,(RpcMethodFnType)local_d8);
      local_f8[0] = local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"blockchain","");
      category_04._M_string_length = in_stack_fffffffffffffc30;
      category_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_04.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_04.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 5,category_04,(RpcMethodFnType)local_f8);
      local_118[0] = local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"blockchain","");
      category_05._M_string_length = in_stack_fffffffffffffc30;
      category_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_05.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_05.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 6,category_05,(RpcMethodFnType)local_118)
      ;
      local_138[0] = local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"blockchain","");
      category_06._M_string_length = in_stack_fffffffffffffc30;
      category_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_06.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_06.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 7,category_06,(RpcMethodFnType)local_138)
      ;
      local_158[0] = local_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"blockchain","");
      category_07._M_string_length = in_stack_fffffffffffffc30;
      category_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_07.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_07.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 8,category_07,(RpcMethodFnType)local_158)
      ;
      local_178[0] = local_168;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"blockchain","");
      category_08._M_string_length = in_stack_fffffffffffffc30;
      category_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_08.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_08.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 9,category_08,(RpcMethodFnType)local_178)
      ;
      local_198[0] = local_188;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"blockchain","");
      category_09._M_string_length = in_stack_fffffffffffffc30;
      category_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_09.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_09.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 10,category_09,(RpcMethodFnType)local_198
                );
      local_1b8[0] = local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"blockchain","");
      category_10._M_string_length = in_stack_fffffffffffffc30;
      category_10._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_10.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_10.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0xb,category_10,
                 (RpcMethodFnType)local_1b8);
      local_1d8[0] = local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"blockchain","");
      category_11._M_string_length = in_stack_fffffffffffffc30;
      category_11._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_11.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_11.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0xc,category_11,
                 (RpcMethodFnType)local_1d8);
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"blockchain","");
      category_12._M_string_length = in_stack_fffffffffffffc30;
      category_12._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_12.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_12.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0xd,category_12,
                 (RpcMethodFnType)local_1f8);
      local_218[0] = local_208;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"blockchain","");
      category_13._M_string_length = in_stack_fffffffffffffc30;
      category_13._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_13.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_13.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0xe,category_13,
                 (RpcMethodFnType)local_218);
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"blockchain","");
      category_14._M_string_length = in_stack_fffffffffffffc30;
      category_14._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_14.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_14.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0xf,category_14,
                 (RpcMethodFnType)local_238);
      local_258[0] = local_248;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"blockchain","");
      category_15._M_string_length = in_stack_fffffffffffffc30;
      category_15._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_15.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_15.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x10,category_15,
                 (RpcMethodFnType)local_258);
      local_278[0] = local_268;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"blockchain","");
      category_16._M_string_length = in_stack_fffffffffffffc30;
      category_16._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_16.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_16.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x11,category_16,
                 (RpcMethodFnType)local_278);
      local_298[0] = local_288;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"blockchain","");
      category_17._M_string_length = in_stack_fffffffffffffc30;
      category_17._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_17.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_17.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x12,category_17,
                 (RpcMethodFnType)local_298);
      local_2b8[0] = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"blockchain","");
      category_18._M_string_length = in_stack_fffffffffffffc30;
      category_18._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_18.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_18.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x13,category_18,
                 (RpcMethodFnType)local_2b8);
      local_2d8[0] = local_2c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"blockchain","");
      category_19._M_string_length = in_stack_fffffffffffffc30;
      category_19._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_19.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_19.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x14,category_19,
                 (RpcMethodFnType)local_2d8);
      local_2f8[0] = local_2e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"blockchain","");
      category_20._M_string_length = in_stack_fffffffffffffc30;
      category_20._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_20.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_20.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x15,category_20,
                 (RpcMethodFnType)local_2f8);
      local_318[0] = local_308;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"blockchain","");
      category_21._M_string_length = in_stack_fffffffffffffc30;
      category_21._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_21.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_21.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x16,category_21,
                 (RpcMethodFnType)local_318);
      local_338[0] = local_328;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"hidden","");
      category_22._M_string_length = in_stack_fffffffffffffc30;
      category_22._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_22.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_22.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x17,category_22,
                 (RpcMethodFnType)local_338);
      local_358[0] = local_348;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"hidden","");
      category_23._M_string_length = in_stack_fffffffffffffc30;
      category_23._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_23.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_23.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x18,category_23,
                 (RpcMethodFnType)local_358);
      local_378[0] = local_368;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"hidden","");
      category_24._M_string_length = in_stack_fffffffffffffc30;
      category_24._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_24.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_24.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x19,category_24,
                 (RpcMethodFnType)local_378);
      local_398[0] = local_388;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"hidden","");
      category_25._M_string_length = in_stack_fffffffffffffc30;
      category_25._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_25.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_25.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x1a,category_25,
                 (RpcMethodFnType)local_398);
      local_3b8[0] = local_3a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"hidden","");
      category_26._M_string_length = in_stack_fffffffffffffc30;
      category_26._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc28;
      category_26.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_26.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x1b,category_26,
                 (RpcMethodFnType)local_3b8);
      puVar3 = &stack0xfffffffffffffc38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffc28,"hidden","");
      category_27._M_string_length = in_stack_fffffffffffffc30;
      category_27._M_dataplus._M_p = puVar3;
      category_27.field_2._M_allocated_capacity = in_stack_fffffffffffffc38;
      category_27.field_2._8_8_ = in_stack_fffffffffffffc40;
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x1c,category_27,
                 (RpcMethodFnType)&stack0xfffffffffffffc28);
      if (puVar3 != &stack0xfffffffffffffc38) {
        operator_delete(puVar3,in_stack_fffffffffffffc38 + 1);
      }
      if (local_3b8[0] != local_3a8) {
        operator_delete(local_3b8[0],local_3a8[0] + 1);
      }
      if (local_398[0] != local_388) {
        operator_delete(local_398[0],local_388[0] + 1);
      }
      if (local_378[0] != local_368) {
        operator_delete(local_378[0],local_368[0] + 1);
      }
      if (local_358[0] != local_348) {
        operator_delete(local_358[0],local_348[0] + 1);
      }
      if (local_338[0] != local_328) {
        operator_delete(local_338[0],local_328[0] + 1);
      }
      if (local_318[0] != local_308) {
        operator_delete(local_318[0],local_308[0] + 1);
      }
      if (local_2f8[0] != local_2e8) {
        operator_delete(local_2f8[0],local_2e8[0] + 1);
      }
      if (local_2d8[0] != local_2c8) {
        operator_delete(local_2d8[0],local_2c8[0] + 1);
      }
      if (local_2b8[0] != local_2a8) {
        operator_delete(local_2b8[0],local_2a8[0] + 1);
      }
      if (local_298[0] != local_288) {
        operator_delete(local_298[0],local_288[0] + 1);
      }
      if (local_278[0] != local_268) {
        operator_delete(local_278[0],local_268[0] + 1);
      }
      if (local_258[0] != local_248) {
        operator_delete(local_258[0],local_248[0] + 1);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0],local_228[0] + 1);
      }
      if (local_218[0] != local_208) {
        operator_delete(local_218[0],local_208[0] + 1);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0],local_1c8[0] + 1);
      }
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0],local_1a8[0] + 1);
      }
      if (local_198[0] != local_188) {
        operator_delete(local_198[0],local_188[0] + 1);
      }
      if (local_178[0] != local_168) {
        operator_delete(local_178[0],local_168[0] + 1);
      }
      if (local_158[0] != local_148) {
        operator_delete(local_158[0],local_148[0] + 1);
      }
      if (local_138[0] != local_128) {
        operator_delete(local_138[0],local_128[0] + 1);
      }
      if (local_118[0] != local_108) {
        operator_delete(local_118[0],local_108[0] + 1);
      }
      if (local_f8[0] != local_e8) {
        operator_delete(local_f8[0],local_e8[0] + 1);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0],local_c8[0] + 1);
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0],local_a8[0] + 1);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterBlockchainRPCCommands(CRPCTable&)::commands);
    }
  }
  lVar2 = 0xe80;
  pcmd = RegisterBlockchainRPCCommands::commands;
  do {
    CRPCTable::appendCommand(t,&pcmd->name,pcmd);
    pcmd = pcmd + 1;
    lVar2 = lVar2 + -0x80;
  } while (lVar2 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterBlockchainRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"blockchain", &getblockchaininfo},
        {"blockchain", &getchaintxstats},
        {"blockchain", &getblockstats},
        {"blockchain", &getbestblockhash},
        {"blockchain", &getblockcount},
        {"blockchain", &getblock},
        {"blockchain", &getblockfrompeer},
        {"blockchain", &getblockhash},
        {"blockchain", &getblockheader},
        {"blockchain", &getchaintips},
        {"blockchain", &getdifficulty},
        {"blockchain", &getdeploymentinfo},
        {"blockchain", &gettxout},
        {"blockchain", &gettxoutsetinfo},
        {"blockchain", &pruneblockchain},
        {"blockchain", &verifychain},
        {"blockchain", &preciousblock},
        {"blockchain", &scantxoutset},
        {"blockchain", &scanblocks},
        {"blockchain", &getblockfilter},
        {"blockchain", &dumptxoutset},
        {"blockchain", &loadtxoutset},
        {"blockchain", &getchainstates},
        {"hidden", &invalidateblock},
        {"hidden", &reconsiderblock},
        {"hidden", &waitfornewblock},
        {"hidden", &waitforblock},
        {"hidden", &waitforblockheight},
        {"hidden", &syncwithvalidationinterfacequeue},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}